

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

_Bool rf_image_get_pixels_as_rgba32_to_buffer(rf_image image,rf_color *dst,rf_int dst_size)

{
  long lVar1;
  rf_source_location source_location;
  rf_image image_00;
  undefined1 auVar2 [16];
  _Bool _Var3;
  int iVar4;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined4 uStack_54;
  _Bool local_19;
  _Bool success;
  rf_int dst_size_local;
  rf_color *dst_local;
  
  auVar5 = image._0_16_;
  local_19 = false;
  _Var3 = rf_is_uncompressed_format(image.format);
  if (_Var3) {
    if (((image.format == RF_UNCOMPRESSED_R32) || (image.format == RF_UNCOMPRESSED_R32G32B32)) ||
       (image.format == RF_UNCOMPRESSED_NORMALIZED)) {
      rf_log_impl(4,0x1b24b2);
    }
    auVar2 = image._8_16_;
    unique0x10000128 = auVar5;
    image_00.data = (void *)auVar2._0_8_;
    image_00.width = auVar2._8_4_;
    image_00.height = auVar2._12_4_;
    iVar4 = rf_image_size(image_00);
    local_19 = rf_format_pixels_to_rgba32
                         ((void *)auVar5._0_8_,(long)iVar4,image.format,dst,dst_size);
  }
  else {
    source_location.proc_name = "rf_image_get_pixels_as_rgba32_to_buffer";
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.line_in_file = 0x3b99;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Function only works for uncompressed formats but was called with format %d.",1,
                (ulong)image.format,"rf_image_get_pixels_as_rgba32_to_buffer",in_R9);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_get_pixels_as_rgba32_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3b99;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_54,1);
  }
  return local_19;
}

Assistant:

RF_API bool rf_image_get_pixels_as_rgba32_to_buffer(rf_image image, rf_color* dst, rf_int dst_size)
{
    bool success = false;

    if (rf_is_uncompressed_format(image.format))
    {
        if (image.format == RF_UNCOMPRESSED_R32 || image.format == RF_UNCOMPRESSED_R32G32B32 || image.format == RF_UNCOMPRESSED_R32G32B32A32)
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "32bit pixel format converted to 8bit per channel.");
        }

        success = rf_format_pixels_to_rgba32(image.data, rf_image_size(image), image.format, dst, dst_size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);

    return success;
}